

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * __thiscall
phosg::StringReader::pget_cstr_abi_cxx11_
          (string *__return_storage_ptr__,StringReader *this,size_t offset)

{
  int8_t __c;
  size_type sVar1;
  uint8_t ch;
  size_t offset_local;
  StringReader *this_local;
  string *ret;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (__return_storage_ptr__);
    __c = pget_s8(this,offset + sVar1);
    if (__c == '\0') break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,__c);
  }
  return __return_storage_ptr__;
}

Assistant:

string StringReader::pget_cstr(size_t offset) const {
  string ret;
  for (;;) {
    uint8_t ch = this->pget_s8(offset + ret.size());
    if (ch != 0) {
      ret += ch;
    } else {
      break;
    }
  }
  return ret;
}